

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

int32_t __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsI32(X3DImporter *this,int pAttrIdx)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  element_type *peVar4;
  size_type sVar5;
  const_reference pvVar6;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  allocator local_69;
  string local_68;
  undefined4 local_44;
  shared_ptr<const_Assimp::FIValue> local_40;
  undefined1 local_30 [8];
  shared_ptr<const_Assimp::FIIntValue> intValue;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  intValue.super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = pAttrIdx;
  pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_40,pFVar3,
             (ulong)intValue.
                    super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_);
  std::dynamic_pointer_cast<Assimp::FIIntValue_const,Assimp::FIValue_const>
            ((shared_ptr<const_Assimp::FIValue> *)local_30);
  std::shared_ptr<const_Assimp::FIValue>::~shared_ptr(&local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&peVar4->value);
    if (sVar5 != 1) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,"Invalid int value",&local_69);
      DeadlyImportError::DeadlyImportError(this_00,&local_68);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    peVar4 = std::
             __shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    pvVar6 = std::vector<int,_std::allocator<int>_>::front(&peVar4->value);
    this_local._4_4_ = *pvVar6;
  }
  else {
    pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar3,(ulong)intValue.
                                     super___shared_ptr<const_Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
    this_local._4_4_ = strtol10((char *)CONCAT44(extraout_var,iVar2),(char **)0x0);
  }
  local_44 = 1;
  std::shared_ptr<const_Assimp::FIIntValue>::~shared_ptr
            ((shared_ptr<const_Assimp::FIIntValue> *)local_30);
  return this_local._4_4_;
}

Assistant:

int32_t X3DImporter::XML_ReadNode_GetAttrVal_AsI32(const int pAttrIdx)
{
    auto intValue = std::dynamic_pointer_cast<const FIIntValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (intValue) {
        if (intValue->value.size() == 1) {
            return intValue->value.front();
        }
        throw DeadlyImportError("Invalid int value");
    }
    else {
        return strtol10(mReader->getAttributeValue(pAttrIdx));
    }
}